

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.h
# Opt level: O3

uint64_t __thiscall
basisu::pvrtc4_image::map_pixel
          (pvrtc4_image *this,uint32_t x,uint32_t y,color_rgba *c,bool perceptual,
          bool alpha_is_significant,bool record)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t s;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  undefined7 in_register_00000081;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_58;
  byte local_54 [20];
  uint32_t local_40;
  uint32_t local_3c;
  pvrtc4_image *local_38;
  
  local_40 = x;
  local_3c = y;
  local_38 = this;
  get_interpolated_colors(this,x,y,(color_rgba *)&local_58.field_1);
  uVar2 = (uint)(c->field_0).m_comps[0];
  if ((int)CONCAT71(in_register_00000081,perceptual) == 0) {
    uVar14 = (uint)(c->field_0).m_comps[1];
    bVar1 = (c->field_0).m_comps[2];
    uVar7 = (uint)bVar1;
    if (alpha_is_significant) {
      auVar15 = pmovzxbd(extraout_XMM0,local_58);
      auVar16._0_4_ = uVar2 - auVar15._0_4_;
      auVar16._4_4_ = (uint)(c->field_0).m_comps[1] - auVar15._4_4_;
      auVar16._8_4_ = (uint)bVar1 - auVar15._8_4_;
      auVar16._12_4_ = (uint)(c->field_0).m_comps[3] - auVar15._12_4_;
      auVar15 = pmulld(auVar16,auVar16);
      auVar15 = phaddd(auVar15,auVar15);
      auVar15 = phaddd(auVar15,auVar15);
      uVar3 = auVar15._0_4_;
    }
    else {
      iVar8 = uVar2 - ((uint)local_58 & 0xff);
      uVar3 = ((uint)bVar1 - (uint)local_58.m_comps[2]) * ((uint)bVar1 - (uint)local_58.m_comps[2])
              + (uVar14 - local_58.m_comps[1]) * (uVar14 - local_58.m_comps[1]) + iVar8 * iVar8;
    }
  }
  else {
    iVar8 = uVar2 - ((uint)local_58 & 0xff);
    uVar14 = (uint)(c->field_0).m_comps[1];
    bVar1 = (c->field_0).m_comps[2];
    iVar10 = ((uint)bVar1 - (uint)local_58.m_comps[2]) * 9 + iVar8 * 0x1b +
             (uVar14 - local_58.m_comps[1]) * 0x5c;
    lVar4 = (long)(iVar8 * 0x80 - iVar10);
    lVar9 = (long)(int)(((uint)bVar1 - (uint)local_58.m_comps[2]) * 0x80 - iVar10);
    uVar3 = ((uint)((int)((ulong)(lVar9 * lVar9) >> 7) * 3) >> 7) +
            (int)((ulong)((long)iVar10 * (long)iVar10) >> 7) +
            ((uint)((int)((ulong)(lVar4 * lVar4) >> 7) * 0x1a) >> 7);
    uVar7 = (uint)bVar1;
    if (alpha_is_significant) {
      iVar8 = ((uint)(c->field_0).m_comps[3] - ((uint)local_58 >> 0x18)) * 0x80;
      uVar3 = uVar3 + ((uint)(iVar8 * iVar8) >> 7);
      uVar7 = (uint)bVar1;
    }
  }
  s = 0;
  lVar4 = 1;
  uVar5 = (ulong)uVar3;
  do {
    bVar1 = local_54[lVar4 * 4 + -4];
    if (perceptual) {
      iVar8 = (uVar7 - local_54[lVar4 * 4 + -2]) * 9 + (uVar2 - bVar1) * 0x1b +
              (uVar14 - local_54[lVar4 * 4 + -3]) * 0x5c;
      lVar12 = (long)(int)((uVar2 - bVar1) * 0x80 - iVar8);
      lVar9 = (long)(int)((uVar7 - local_54[lVar4 * 4 + -2]) * 0x80 - iVar8);
      uVar3 = ((uint)((int)((ulong)(lVar9 * lVar9) >> 7) * 3) >> 7) +
              (int)((ulong)((long)iVar8 * (long)iVar8) >> 7) +
              ((uint)((int)((ulong)(lVar12 * lVar12) >> 7) * 0x1a) >> 7);
      if (alpha_is_significant) {
        iVar8 = ((uint)(c->field_0).m_comps[3] - (uint)local_54[lVar4 * 4 + -1]) * 0x80;
        uVar3 = uVar3 + ((uint)(iVar8 * iVar8) >> 7);
      }
    }
    else if (alpha_is_significant) {
      iVar10 = uVar2 - bVar1;
      iVar8 = uVar14 - local_54[lVar4 * 4 + -3];
      iVar13 = uVar7 - local_54[lVar4 * 4 + -2];
      iVar11 = (uint)(c->field_0).m_comps[3] - (uint)local_54[lVar4 * 4 + -1];
      uVar3 = iVar11 * iVar11 + iVar13 * iVar13 + iVar8 * iVar8 + iVar10 * iVar10;
    }
    else {
      iVar8 = uVar2 - bVar1;
      iVar10 = uVar14 - local_54[lVar4 * 4 + -3];
      iVar11 = uVar7 - local_54[lVar4 * 4 + -2];
      uVar3 = iVar11 * iVar11 + iVar10 * iVar10 + iVar8 * iVar8;
    }
    uVar6 = (ulong)uVar3;
    if (uVar5 >= uVar6 && uVar5 != uVar6) {
      s = (uint32_t)lVar4;
    }
    if (uVar5 < uVar6) {
      uVar6 = uVar5;
    }
    lVar4 = lVar4 + 1;
    uVar5 = uVar6;
  } while (lVar4 != 4);
  if (record) {
    set_modulation(local_38,local_40,local_3c,s);
  }
  return uVar6;
}

Assistant:

inline uint64_t map_pixel(uint32_t x, uint32_t y, const color_rgba& c, bool perceptual, bool alpha_is_significant, bool record = true)
		{
			color_rgba v[4];
			get_interpolated_colors(x, y, v);

			uint64_t best_dist = color_distance(perceptual, c, v[0], alpha_is_significant);
			uint32_t best_v = 0;
			for (uint32_t i = 1; i < 4; i++)
			{
				uint64_t dist = color_distance(perceptual, c, v[i], alpha_is_significant);
				if (dist < best_dist)
				{
					best_dist = dist;
					best_v = i;
				}
			}

			if (record)
				set_modulation(x, y, best_v);

			return best_dist;
		}